

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

LIndex __thiscall
PlanningUnitMADPDiscrete::IndividualToJointActionObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index t,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indivIs)

{
  uint uVar1;
  Index IVar2;
  value_type puVar3;
  reference ppuVar4;
  const_reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  ulong uVar8;
  uint in_ESI;
  long *in_RDI;
  LIndex jaohI;
  Index ts_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> jacs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> jobs;
  Index agentI_2;
  Index ts;
  Index agentI_1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  stageAction;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  stageObserv;
  Index aohI_thisAgent;
  Index agentI;
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> actionSeqs;
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> observSeqs;
  size_t nrAg;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffdd8;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  value_type in_stack_fffffffffffffdf0;
  Index in_stack_fffffffffffffdf4;
  size_type in_stack_fffffffffffffdf8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_fffffffffffffe00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  Index *in_stack_fffffffffffffe30;
  Index *in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffe50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *Jobservations;
  undefined4 in_stack_fffffffffffffe70;
  uint in_stack_fffffffffffffe74;
  uint in_stack_fffffffffffffe7c;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffe80;
  uint local_130;
  undefined1 local_129 [33];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_108;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a9;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_90;
  value_type local_74;
  uint local_70;
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> local_68 [2];
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> local_38;
  ulong local_20;
  uint local_c;
  
  local_c = in_ESI;
  local_20 = (**(code **)(*in_RDI + 0x30))();
  std::allocator<unsigned_int_*>::allocator((allocator<unsigned_int_*> *)0x9d9184);
  std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::vector
            ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)in_stack_fffffffffffffe00,
             in_stack_fffffffffffffdf8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  std::allocator<unsigned_int_*>::~allocator((allocator<unsigned_int_*> *)0x9d91b0);
  std::allocator<unsigned_int_*>::allocator((allocator<unsigned_int_*> *)0x9d91d5);
  std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::vector
            ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)in_stack_fffffffffffffe00,
             in_stack_fffffffffffffdf8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  std::allocator<unsigned_int_*>::~allocator((allocator<unsigned_int_*> *)0x9d9201);
  for (local_70 = 0; local_70 < local_20; local_70 = local_70 + 1) {
    puVar3 = (value_type)operator_new__((ulong)local_c << 2);
    ppuVar4 = std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::operator[]
                        (&local_38,(ulong)local_70);
    *ppuVar4 = puVar3;
    puVar3 = (value_type)operator_new__((ulong)local_c << 2);
    ppuVar4 = std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::operator[]
                        (local_68,(ulong)local_70);
    *ppuVar4 = puVar3;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
    local_74 = *pvVar5;
    in_stack_fffffffffffffe74 = local_70;
    in_stack_fffffffffffffe7c = local_c;
    ppuVar4 = std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::operator[]
                        (local_68,(ulong)local_70);
    in_stack_fffffffffffffe80 = (PlanningUnitMADPDiscrete *)*ppuVar4;
    std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::operator[]
              (&local_38,(ulong)local_70);
    GetActionObservationHistoryArrays
              (in_stack_fffffffffffffe50,(Index)((ulong)in_stack_fffffffffffffe48 >> 0x20),
               (Index)in_stack_fffffffffffffe48,(Index)((ulong)in_stack_fffffffffffffe40 >> 0x20),
               in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  }
  Jobservations = &local_a9;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x9d9406);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe00,
             in_stack_fffffffffffffdf8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x9d9437);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
           (value_type *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
           (allocator_type *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x9d9468);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x9d9482);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x9d94ad);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe00,
             in_stack_fffffffffffffdf8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x9d94d8);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
           (value_type *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
           (allocator_type *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x9d9506);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x9d9520);
  for (local_e8 = 0; local_e8 < local_20; local_e8 = local_e8 + 1) {
    for (local_ec = 0; local_ec < local_c; local_ec = local_ec + 1) {
      ppuVar4 = std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::operator[]
                          (&local_38,(ulong)local_e8);
      uVar1 = (*ppuVar4)[local_ec];
      pvVar6 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&local_90,(ulong)local_ec);
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar6,(ulong)local_e8);
      *pvVar7 = uVar1;
      ppuVar4 = std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::operator[]
                          (local_68,(ulong)local_e8);
      uVar1 = (*ppuVar4)[local_ec];
      pvVar6 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&local_c8,(ulong)local_ec);
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar6,(ulong)local_e8);
      *pvVar7 = uVar1;
    }
  }
  for (local_f0 = 0; local_f0 < local_20; local_f0 = local_f0 + 1) {
    ppuVar4 = std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::operator[]
                        (&local_38,(ulong)local_f0);
    if (*ppuVar4 != (value_type)0x0) {
      operator_delete__(*ppuVar4);
    }
    ppuVar4 = std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::operator[]
                        (local_68,(ulong)local_f0);
    if (*ppuVar4 != (value_type)0x0) {
      operator_delete__(*ppuVar4);
    }
  }
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x9d978f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe00,
             in_stack_fffffffffffffdf8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x9d97b5);
  uVar8 = (ulong)local_c;
  this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_129;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x9d97d3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (this_00,uVar8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x9d97f9);
  for (local_130 = 0; local_130 < local_c; local_130 = local_130 + 1) {
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator[](&local_90,(ulong)local_130);
    in_stack_fffffffffffffdf4 =
         IndividualToJointObservationIndices(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_108,(ulong)local_130);
    *pvVar7 = in_stack_fffffffffffffdf4;
    pvVar6 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](&local_c8,(ulong)local_130);
    in_stack_fffffffffffffdf0 = (**(code **)(*in_RDI + 0x48))(in_RDI,pvVar6);
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_129 + 1),
                        (ulong)local_130);
    *pvVar7 = in_stack_fffffffffffffdf0;
  }
  IVar2 = GetJointActionObservationHistoryIndex
                    (in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),Jobservations);
  uVar8 = (ulong)IVar2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::~vector
            ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::~vector
            ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  return uVar8;
}

Assistant:

LIndex 
PlanningUnitMADPDiscrete::IndividualToJointActionObservationHistoryIndex(
        Index t, const vector<Index>& indivIs) const
{
    //individual observation history index -> individual observation sequences
    size_t nrAg = GetNrAgents();
    vector< Index* > observSeqs(nrAg);
    vector< Index* > actionSeqs(nrAg);
    for (Index agentI = 0; agentI < nrAg; agentI++)
    {
        observSeqs[agentI] = new Index[t];
        actionSeqs[agentI] = new Index[t];
        Index aohI_thisAgent = indivIs.at(agentI);
        GetActionObservationHistoryArrays (agentI, aohI_thisAgent, t, 
                actionSeqs[agentI], observSeqs[agentI]  );
    }

    // observSeqs[agent][ts] -> stageObserv[ts][agent]
    vector< vector<Index> > stageObserv(t, vector<Index>(nrAg) );
    vector< vector<Index> > stageAction(t, vector<Index>(nrAg) );
    for (Index agentI = 0; agentI < nrAg; agentI++)
        for (Index ts = 0; ts < t; ts++)
        {
            stageObserv[ts][agentI] = observSeqs[agentI][ts];    
            stageAction[ts][agentI] = actionSeqs[agentI][ts];    
        }
    
    for (Index agentI = 0; agentI < nrAg; agentI++)
    {
        delete [] observSeqs[agentI];
        delete [] actionSeqs[agentI];
    }
    
    //individual observation sequences -> joint observation sequences.
    vector<Index> jobs(t);
    vector<Index> jacs(t);
    
    for (Index ts = 0; ts < t; ts++)
    {
        jobs[ts] = IndividualToJointObservationIndices(stageObserv[ts]);
        jacs[ts] = IndividualToJointActionIndices(stageAction[ts]);
        
    }

    //joint observation sequences -> joint history index.
    LIndex jaohI = GetJointActionObservationHistoryIndex(t, jacs, jobs);
    return(jaohI);
    
}